

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_id.c
# Opt level: O1

int mpt_message_buf2id(void *ptr,size_t len,uint64_t *iptr)

{
  uint uVar1;
  uint8_t *buf;
  
  if (len == 0) {
    uVar1 = 0;
    if (iptr != (uint64_t *)0x0) {
      *iptr = 0;
      return uVar1;
    }
  }
  else {
    if (len != 1) {
      return (int)(*ptr != '\0');
    }
    uVar1 = 2;
    if (*ptr == '\0') {
      uVar1 = (uint)(*(char *)((long)ptr + 1) != '\0');
    }
  }
  return uVar1;
}

Assistant:

int mpt_message_buf2id(const void *ptr, size_t len, uint64_t *iptr)
{
	const uint8_t *buf = ptr;
	uint64_t id;
	size_t used;
	uint8_t val;
	
	if (!len) {
		if (iptr) *iptr = 0;
		return 0;
	}
	/* initial value setup */
	id = *buf++;
	used = id ? 1 : 0;
	
	/* add higher order ID parts */
	while (!--len) {
		val = *buf++;
		id *= 0x100;
		if ((val || used) && ++used > sizeof(id)) {
			return MPT_ERROR(BadValue);
		}
		id |= val;
	}
	return used;
}